

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void fmt::v5::internal::
     parse_format_string<false,char,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&>
               (basic_string_view<char> format_str,
               format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
               *handler)

{
  ulong uVar1;
  internal *piVar2;
  basic_buffer<char> *pbVar3;
  size_t sVar4;
  bool bVar5;
  int iVar6;
  internal *piVar7;
  id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
  *in_RCX;
  internal *begin;
  char *pcVar8;
  basic_buffer<char> *c;
  internal *piVar9;
  internal *end;
  null_terminating_iterator<char> nVar10;
  iterator iVar11;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *local_38;
  
  begin = (internal *)format_str.data_;
  end = begin + format_str.size_;
  do {
    piVar7 = (internal *)memchr(begin,0x7b,(long)end - (long)begin);
    in_RCX = (id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
              *)CONCAT71((int7)((ulong)in_RCX >> 8),piVar7 != end);
    piVar9 = begin;
    if (piVar7 != (internal *)0x0 && piVar7 != end) {
      do {
        piVar9 = (internal *)memchr(begin,0x7d,(long)piVar7 - (long)begin);
        in_RCX = (id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
                  *)CONCAT71((int7)((ulong)in_RCX >> 8),piVar9 != piVar7);
        if (piVar9 != (internal *)0x0 && piVar9 != piVar7) {
          piVar2 = piVar9 + 1;
          if ((piVar2 == piVar7) || (*piVar2 != (internal)0x7d)) {
            error_handler::on_error((error_handler *)handler,"unmatched \'}\' in format string");
          }
          format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          ::on_text(handler,(char *)begin,(char *)piVar2);
          begin = piVar9 + 2;
          bVar5 = true;
        }
        else {
          format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          ::on_text(handler,(char *)begin,(char *)piVar7);
          bVar5 = false;
        }
      } while (bVar5);
      piVar9 = piVar7 + 1;
      if ((piVar9 == end) || (*piVar9 != (internal)0x7b)) {
        nVar10.end_ = (char *)&local_38;
        nVar10.ptr_ = (char *)end;
        local_38 = handler;
        nVar10 = parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&,char>>
                           (piVar9,nVar10,in_RCX);
        iVar11.end_ = nVar10.end_;
        pcVar8 = nVar10.ptr_;
        if (pcVar8 == iVar11.end_) {
LAB_0011ebe4:
          pcVar8 = "missing \'}\' in format string";
LAB_0011ebee:
          error_handler::on_error((error_handler *)handler,pcVar8);
        }
        if (*pcVar8 == '}') {
          format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          ::on_replacement_field(handler,nVar10);
        }
        else {
          if ((pcVar8 == iVar11.end_) || (*pcVar8 != ':')) goto LAB_0011ebe4;
          iVar11.ptr_ = pcVar8 + 1;
          iVar11 = format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                   ::on_format_specs(handler,iVar11);
          pcVar8 = iVar11.ptr_;
          if ((pcVar8 == iVar11.end_) || (*pcVar8 != '}')) {
            pcVar8 = "unknown format specifier";
            goto LAB_0011ebee;
          }
        }
        begin = (internal *)(pcVar8 + 1);
        iVar6 = 0;
      }
      else {
        pbVar3 = (handler->context).
                 super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                 .out_.container;
        sVar4 = pbVar3->size_;
        uVar1 = sVar4 + 1;
        if (pbVar3->capacity_ < uVar1) {
          (**pbVar3->_vptr_basic_buffer)(pbVar3,uVar1);
        }
        begin = piVar7 + 2;
        pbVar3->size_ = uVar1;
        in_RCX = (id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
                  *)CONCAT71((int7)(uVar1 >> 8),*piVar9);
        *(internal *)(pbVar3->ptr_ + sVar4) = *piVar9;
        (handler->context).
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
        .out_.container = pbVar3;
        iVar6 = 3;
      }
    }
    else {
      do {
        piVar7 = (internal *)memchr(piVar9,0x7d,(long)end - (long)piVar9);
        in_RCX = (id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
                  *)CONCAT71((int7)((ulong)in_RCX >> 8),piVar7 != end);
        if (piVar7 != (internal *)0x0 && piVar7 != end) {
          piVar2 = piVar7 + 1;
          if ((piVar2 == end) || (*piVar2 != (internal)0x7d)) {
            error_handler::on_error((error_handler *)handler,"unmatched \'}\' in format string");
          }
          format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          ::on_text(handler,(char *)piVar9,(char *)piVar2);
          piVar9 = piVar7 + 2;
          bVar5 = true;
        }
        else {
          format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          ::on_text(handler,(char *)piVar9,(char *)end);
          bVar5 = false;
        }
      } while (bVar5);
      iVar6 = 1;
    }
    if ((iVar6 != 0) && (iVar6 != 3)) {
      return;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      for (;;) {
        auto p = find<IS_CONSTEXPR>(begin, end, '}');
        if (p == end) {
          handler_.on_text(begin, end);
          return;
        }
        ++p;
        if (p == end || *p != '}') {
          handler_.on_error("unmatched '}' in format string");
          return;
        }
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  for (;;) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on long format strings.
    auto p = find<IS_CONSTEXPR>(begin, end, '{');
    if (p == end) {
      write(begin, end);
      return;
    }
    write(begin, p);
    ++p;
    if (p != end && *p == '{') {
      handler.on_text(p, p + 1);
      begin = p + 1;
      continue;
    }

    internal::null_terminating_iterator<Char> it(p, end);
    it = parse_arg_id(it, id_adapter<Handler, Char>(handler));
    if (*it == '}') {
      handler.on_replacement_field(it);
    } else if (*it == ':') {
      ++it;
      it = handler.on_format_specs(it);
      if (*it != '}') {
        handler.on_error("unknown format specifier");
        return;
      }
    } else {
      handler.on_error("missing '}' in format string");
      return;
    }
    begin = pointer_from(it) + 1;
  }
}